

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O1

vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *
tinyusdz::lerp<tinyusdz::value::half>
          (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *a,
          vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *b,double t)

{
  half hVar1;
  ulong uVar2;
  ulong __new_size;
  long lVar3;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = (long)(a->
                super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(a->
                super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>).
                _M_impl.super__Vector_impl_data._M_start >> 1;
  __new_size = (long)(b->
                     super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(b->
                     super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 1;
  if (uVar2 <= __new_size) {
    __new_size = uVar2;
  }
  if (__new_size != 0) {
    ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::resize
              (__return_storage_ptr__,__new_size);
    if ((long)(a->super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>)
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>)
              ._M_impl.super__Vector_impl_data._M_start ==
        (long)(b->super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>)
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(b->super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>)
              ._M_impl.super__Vector_impl_data._M_start) {
      lVar3 = 0;
      do {
        hVar1 = lerp<tinyusdz::value::half>
                          ((half *)((long)&((a->
                                            super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->value +
                                   lVar3),
                           (half *)((long)&((b->
                                            super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->value +
                                   lVar3),t);
        *(uint16_t *)
         ((long)&((__return_storage_ptr__->
                  super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>)
                  ._M_impl.super__Vector_impl_data._M_start)->value + lVar3) = hVar1.value;
        lVar3 = lVar3 + 2;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}